

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * getLinkedTargetsContent
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *prop,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   )

{
  size_type *psVar1;
  bool quiet;
  bool evaluateForBuildsystem;
  pointer pcVar2;
  cmLinkImplementationLibraries *pcVar3;
  cmLocalGenerator *lg;
  cmLinkImplementationLibraries *extraout_RAX;
  cmLinkImplementationLibraries *extraout_RAX_00;
  cmLinkImplementationLibraries *pcVar4;
  string libResult;
  cmListFileBacktrace local_1f8;
  string local_1e8;
  string local_1c8;
  string *local_1a8;
  cmGeneratorExpressionDAGChecker *local_1a0;
  cmLinkImplementationLibraries *local_198;
  cmGeneratorExpressionContext libContext;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1a8 = prop;
  local_1a0 = dagChecker;
  pcVar3 = cmGeneratorTarget::GetLinkImplementationLibraries(target,&context->Config,Usage);
  if (pcVar3 != (cmLinkImplementationLibraries *)0x0) {
    pcVar4 = (cmLinkImplementationLibraries *)
             (pcVar3->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (cmLinkImplementationLibraries *)
             (pcVar3->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_198 = pcVar3;
    if (pcVar4 != pcVar3) {
      do {
        if ((pcVar4->Objects).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          lg = cmGeneratorTarget::GetLocalGenerator(target);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          pcVar2 = (context->Config)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar2,pcVar2 + (context->Config)._M_string_length);
          quiet = context->Quiet;
          evaluateForBuildsystem = context->EvaluateForBuildsystem;
          local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    (pcVar4->WrongConfigLibraries).
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (pcVar4->WrongConfigLibraries).
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if ((pointer)local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                       .
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(((pointer)
                         local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->String)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(((pointer)
                         local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->String)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          pcVar2 = (context->Language)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,pcVar2,pcVar2 + (context->Language)._M_string_length);
          cmGeneratorExpressionContext::cmGeneratorExpressionContext
                    (&libContext,lg,&local_1e8,quiet,target,target,evaluateForBuildsystem,&local_1f8
                     ,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                       .
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                       .
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          cmGeneratorTarget::EvaluateInterfaceProperty
                    (&libResult,
                     (cmGeneratorTarget *)
                     (pcVar4->Objects).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_1a8,&libContext,local_1a0,Usage
                    );
          if (libResult._M_string_length != 0) {
            if (__return_storage_ptr__->_M_string_length == 0) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&libResult)
              ;
            }
            else {
              std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)libResult._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libResult._M_dataplus._M_p != &libResult.field_2) {
            operator_delete(libResult._M_dataplus._M_p,libResult.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libContext.Language._M_dataplus._M_p != &libContext.Language.field_2) {
            operator_delete(libContext.Language._M_dataplus._M_p,
                            libContext.Language.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libContext.Config._M_dataplus._M_p != &libContext.Config.field_2) {
            operator_delete(libContext.Config._M_dataplus._M_p,
                            libContext.Config.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~_Rb_tree(&libContext.MaxLanguageStandard._M_t);
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree(&libContext.SourceSensitiveTargets._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&libContext.SeenTargetProperties._M_t);
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree(&libContext.AllTargets._M_t);
          std::
          _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          ::~_Rb_tree(&libContext.DependTargets._M_t);
          pcVar3 = extraout_RAX;
          if (libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (libContext.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
            pcVar3 = extraout_RAX_00;
          }
        }
        pcVar4 = (cmLinkImplementationLibraries *)&pcVar4->HadContextSensitiveCondition;
      } while (pcVar4 != local_198);
    }
  }
  return (string *)pcVar3;
}

Assistant:

static std::string getLinkedTargetsContent(
  cmGeneratorTarget const* target, std::string const& prop,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker)
{
  std::string result;
  if (cmLinkImplementationLibraries const* impl =
        target->GetLinkImplementationLibraries(
          context->Config, cmGeneratorTarget::LinkInterfaceFor::Usage)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in our
        // caller's property and hand-evaluate it as if it were compiled.
        // Create a context as cmCompiledGeneratorExpression::Evaluate does.
        cmGeneratorExpressionContext libContext(
          target->GetLocalGenerator(), context->Config, context->Quiet, target,
          target, context->EvaluateForBuildsystem, lib.Backtrace,
          context->Language);
        std::string libResult =
          lib.Target->EvaluateInterfaceProperty(prop, &libContext, dagChecker);
        if (!libResult.empty()) {
          if (result.empty()) {
            result = std::move(libResult);
          } else {
            result.reserve(result.size() + 1 + libResult.size());
            result += ";";
            result += libResult;
          }
        }
      }
    }
  }
  return result;
}